

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O2

HeapBlock * __thiscall Memory::HeapBlockMap64::GetHeapBlock(HeapBlockMap64 *this,void *address)

{
  L2MapChunk *pLVar1;
  Node *pNVar2;
  
  pNVar2 = FindNode(this,address);
  if (pNVar2 != (Node *)0x0) {
    pLVar1 = (pNVar2->map).map[(ulong)address >> 0x14 & 0xfff];
    if (pLVar1 != (L2MapChunk *)0x0) {
      return *(HeapBlock **)((long)pLVar1->map + (ulong)((uint)address >> 9 & 0x7f8));
    }
  }
  return (HeapBlock *)0x0;
}

Assistant:

HeapBlock *
HeapBlockMap64::GetHeapBlock(void * address)
{
    Node * node = FindNode(address);
    if (node == nullptr)
    {
        return nullptr;
    }
    return node->map.GetHeapBlock(address);
}